

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_decode(opj_jp2_t *jp2,opj_stream_private_t *p_stream,opj_image_t *p_image,
                       opj_event_mgr_t *p_manager)

{
  opj_jp2_color_t *color;
  opj_jp2_pclr_t *poVar1;
  OPJ_BOOL OVar2;
  OPJ_COLOR_SPACE OVar3;
  
  if (p_image != (opj_image_t *)0x0) {
    OVar2 = opj_j2k_decode(jp2->j2k,p_stream,p_image,p_manager);
    if (OVar2 == 0) {
      opj_event_msg(p_manager,1,"Failed to decode the codestream in the JP2 file\n");
      return 0;
    }
    if ((jp2->j2k->m_specific_param).m_decoder.m_numcomps_to_decode != 0) {
      return 1;
    }
    if (jp2->ignore_pclr_cmap_cdef != 0) {
      return 1;
    }
    color = &jp2->color;
    OVar2 = opj_jp2_check_color(p_image,color,p_manager);
    if (OVar2 != 0) {
      switch(jp2->enumcs) {
      case 0x10:
        OVar3 = OPJ_CLRSPC_SRGB;
        break;
      case 0x11:
        OVar3 = OPJ_CLRSPC_GRAY;
        break;
      case 0x12:
        OVar3 = OPJ_CLRSPC_SYCC;
        break;
      case 0x18:
        OVar3 = OPJ_CLRSPC_EYCC;
        break;
      default:
        if (jp2->enumcs == 0xc) {
          OVar3 = OPJ_CLRSPC_CMYK;
          break;
        }
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
        OVar3 = OPJ_CLRSPC_UNKNOWN;
      }
      p_image->color_space = OVar3;
      poVar1 = (jp2->color).jp2_pclr;
      if (poVar1 != (opj_jp2_pclr_t *)0x0) {
        if (poVar1->cmap == (opj_jp2_cmap_comp_t *)0x0) {
          opj_jp2_free_pclr(color);
        }
        else {
          OVar2 = opj_jp2_apply_pclr(p_image,color,p_manager);
          if (OVar2 == 0) {
            return 0;
          }
        }
      }
      if ((jp2->color).jp2_cdef != (opj_jp2_cdef_t *)0x0) {
        opj_jp2_apply_cdef(p_image,color,p_manager);
      }
      if (color->icc_profile_buf != (OPJ_BYTE *)0x0) {
        p_image->icc_profile_buf = color->icc_profile_buf;
        p_image->icc_profile_len = (jp2->color).icc_profile_len;
        (jp2->color).icc_profile_buf = (OPJ_BYTE *)0x0;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_jp2_decode(opj_jp2_t *jp2,
                        opj_stream_private_t *p_stream,
                        opj_image_t* p_image,
                        opj_event_mgr_t * p_manager)
{
    if (!p_image) {
        return OPJ_FALSE;
    }

    /* J2K decoding */
    if (! opj_j2k_decode(jp2->j2k, p_stream, p_image, p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Failed to decode the codestream in the JP2 file\n");
        return OPJ_FALSE;
    }

    if (jp2->j2k->m_specific_param.m_decoder.m_numcomps_to_decode) {
        /* Bypass all JP2 component transforms */
        return OPJ_TRUE;
    }

    if (!jp2->ignore_pclr_cmap_cdef) {
        if (!opj_jp2_check_color(p_image, &(jp2->color), p_manager)) {
            return OPJ_FALSE;
        }

        /* Set Image Color Space */
        if (jp2->enumcs == 16) {
            p_image->color_space = OPJ_CLRSPC_SRGB;
        } else if (jp2->enumcs == 17) {
            p_image->color_space = OPJ_CLRSPC_GRAY;
        } else if (jp2->enumcs == 18) {
            p_image->color_space = OPJ_CLRSPC_SYCC;
        } else if (jp2->enumcs == 24) {
            p_image->color_space = OPJ_CLRSPC_EYCC;
        } else if (jp2->enumcs == 12) {
            p_image->color_space = OPJ_CLRSPC_CMYK;
        } else {
            p_image->color_space = OPJ_CLRSPC_UNKNOWN;
        }

        if (jp2->color.jp2_pclr) {
            /* Part 1, I.5.3.4: Either both or none : */
            if (!jp2->color.jp2_pclr->cmap) {
                opj_jp2_free_pclr(&(jp2->color));
            } else {
                if (!opj_jp2_apply_pclr(p_image, &(jp2->color), p_manager)) {
                    return OPJ_FALSE;
                }
            }
        }

        /* Apply the color space if needed */
        if (jp2->color.jp2_cdef) {
            opj_jp2_apply_cdef(p_image, &(jp2->color), p_manager);
        }

        if (jp2->color.icc_profile_buf) {
            p_image->icc_profile_buf = jp2->color.icc_profile_buf;
            p_image->icc_profile_len = jp2->color.icc_profile_len;
            jp2->color.icc_profile_buf = NULL;
        }
    }

    return OPJ_TRUE;
}